

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O3

void worker(void *arg)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uv__queue *puVar3;
  uv__queue *puVar4;
  
  uv_sem_post((uv_sem_t *)arg);
  uv_mutex_lock(&mutex);
LAB_001e1b5d:
  while (puVar3 = wq.next, wq.next == &wq) {
LAB_001e1d0a:
    idle_threads = idle_threads + 1;
    uv_cond_wait(&cond,&mutex);
    idle_threads = idle_threads - 1;
  }
  if (wq.next == &run_slow_work_message) {
    if ((run_slow_work_message.next == &wq) && (nthreads + 1 >> 1 <= slow_io_work_running))
    goto LAB_001e1d0a;
    (run_slow_work_message.prev)->next = run_slow_work_message.next;
    (run_slow_work_message.next)->prev = run_slow_work_message.prev;
    puVar4 = slow_io_pending_wq.next;
    run_slow_work_message.next = &run_slow_work_message;
    run_slow_work_message.prev = &run_slow_work_message;
    if (nthreads + 1 >> 1 <= slow_io_work_running) {
      run_slow_work_message.next = &wq;
      run_slow_work_message.prev = wq.prev;
      (wq.prev)->next = &run_slow_work_message;
      wq.prev = &run_slow_work_message;
      goto LAB_001e1b5d;
    }
    if (slow_io_pending_wq.next == &slow_io_pending_wq) goto LAB_001e1b5d;
    slow_io_work_running = slow_io_work_running + 1;
    puVar1 = (slow_io_pending_wq.next)->next;
    (slow_io_pending_wq.next)->prev->next = puVar1;
    puVar1->prev = puVar4->prev;
    puVar4->next = puVar4;
    puVar4->prev = puVar4;
    if (slow_io_pending_wq.next != &slow_io_pending_wq) {
      run_slow_work_message.next = &wq;
      run_slow_work_message.prev = wq.prev;
      (wq.prev)->next = &run_slow_work_message;
      wq.prev = &run_slow_work_message;
      if (idle_threads != 0) {
        uv_cond_signal(&cond);
      }
    }
  }
  else {
    if (wq.next == &exit_message) {
      uv_cond_signal(&cond);
      uv_mutex_unlock(&mutex);
      return;
    }
    puVar4 = (wq.next)->next;
    (wq.next)->prev->next = puVar4;
    puVar4->prev = puVar3->prev;
    puVar3->next = puVar3;
    puVar3->prev = puVar3;
    puVar4 = puVar3;
  }
  uv_mutex_unlock(&mutex);
  (*(code *)puVar4[-2].prev)(&puVar4[-2].prev);
  uv_mutex_lock((uv_mutex_t *)&puVar4[-1].prev[10].prev);
  puVar4[-2].prev = (uv__queue *)0x0;
  puVar1 = puVar4[-1].prev;
  puVar4->next = (uv__queue *)&puVar1[9].prev;
  puVar2 = puVar1[10].next;
  puVar4->prev = puVar2;
  puVar2->next = puVar4;
  puVar1[10].next = puVar4;
  uv_async_send((uv_async_t *)(puVar4[-1].prev + 0xd));
  uv_mutex_unlock((uv_mutex_t *)&puVar4[-1].prev[10].prev);
  uv_mutex_lock(&mutex);
  if (puVar3 == &run_slow_work_message) {
    slow_io_work_running = slow_io_work_running - 1;
  }
  goto LAB_001e1b5d;
}

Assistant:

static void worker(void* arg) {
  worker_config* c = arg;

  if (c->delay)
    uv_sleep(c->delay);

  uv_mutex_lock(&c->mutex);
  ASSERT_OK(c->posted);
  uv_sem_post(&c->sem);
  c->posted = 1;
  uv_mutex_unlock(&c->mutex);
}